

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O2

int google::protobuf::internal::WireFormat::FieldDataOnlyByteSize
              (FieldDescriptor *field,Message *message)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  int32 iVar4;
  uint32 uVar5;
  undefined4 extraout_var;
  string *value;
  long *plVar6;
  uint64 uVar7;
  long lVar8;
  int64 iVar9;
  MessageLite *pMVar10;
  long *plVar11;
  uint uVar12;
  uint uVar13;
  string scratch;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40 [16];
  
  iVar2 = (*(message->super_MessageLite)._vptr_MessageLite[0x12])(message);
  plVar11 = (long *)CONCAT44(extraout_var,iVar2);
  if (*(int *)(field + 0x30) == 3) {
    uVar3 = (**(code **)(*plVar11 + 0x30))();
  }
  else {
    bVar1 = (**(code **)(*plVar11 + 0x28))(plVar11,message,field);
    uVar3 = (uint)bVar1;
  }
  uVar12 = uVar3;
  switch(*(undefined4 *)(field + 0x2c)) {
  case 1:
  case 6:
  case 0x10:
    uVar12 = uVar3 << 3;
    break;
  case 2:
  case 7:
  case 0xf:
    uVar12 = uVar3 << 2;
    break;
  case 3:
    if (*(int *)(field + 0x30) != 3) {
      uVar7 = (**(code **)(*plVar11 + 0x70))(plVar11,message,field);
LAB_001ca9b8:
      iVar2 = io::CodedOutputStream::VarintSize64(uVar7);
      return iVar2;
    }
    uVar13 = 0;
    if ((int)uVar3 < 1) {
      uVar3 = 0;
    }
    uVar12 = 0;
    for (; uVar3 != uVar13; uVar13 = uVar13 + 1) {
      uVar7 = (**(code **)(*plVar11 + 0x120))(plVar11,message,field,uVar13);
      iVar2 = io::CodedOutputStream::VarintSize64(uVar7);
      uVar12 = uVar12 + iVar2;
    }
    break;
  case 4:
    if (*(int *)(field + 0x30) != 3) {
      uVar7 = (**(code **)(*plVar11 + 0x80))(plVar11,message,field);
      goto LAB_001ca9b8;
    }
    uVar13 = 0;
    if ((int)uVar3 < 1) {
      uVar3 = 0;
    }
    uVar12 = 0;
    for (; uVar3 != uVar13; uVar13 = uVar13 + 1) {
      uVar7 = (**(code **)(*plVar11 + 0x130))(plVar11,message,field,uVar13);
      iVar2 = io::CodedOutputStream::VarintSize64(uVar7);
      uVar12 = uVar12 + iVar2;
    }
    break;
  case 5:
    if (*(int *)(field + 0x30) != 3) {
      iVar4 = (**(code **)(*plVar11 + 0x68))(plVar11,message,field);
LAB_001ca996:
      iVar2 = io::CodedOutputStream::VarintSize32SignExtended(iVar4);
      return iVar2;
    }
    uVar13 = 0;
    if ((int)uVar3 < 1) {
      uVar3 = 0;
    }
    uVar12 = 0;
    for (; uVar3 != uVar13; uVar13 = uVar13 + 1) {
      iVar4 = (**(code **)(*plVar11 + 0x118))(plVar11,message,field,uVar13);
      iVar2 = io::CodedOutputStream::VarintSize32SignExtended(iVar4);
      uVar12 = uVar12 + iVar2;
    }
    break;
  case 8:
    break;
  case 9:
  case 0xc:
    uVar13 = 0;
    if ((int)uVar3 < 1) {
      uVar3 = 0;
    }
    uVar12 = 0;
    for (; uVar3 != uVar13; uVar13 = uVar13 + 1) {
      local_50 = local_40;
      local_48 = 0;
      local_40[0] = 0;
      if (*(int *)(field + 0x30) == 3) {
        value = (string *)
                (**(code **)(*plVar11 + 0x168))(plVar11,message,field,uVar13,(string *)&local_50);
      }
      else {
        value = (string *)(**(code **)(*plVar11 + 0xb8))(plVar11,message,field,(string *)&local_50);
      }
      iVar2 = WireFormatLite::StringSize(value);
      uVar12 = uVar12 + iVar2;
      std::__cxx11::string::~string((string *)&local_50);
    }
    break;
  case 10:
    if (*(int *)(field + 0x30) != 3) {
      plVar11 = (long *)(**(code **)(*plVar11 + 0xb0))(plVar11,message,field,0);
      iVar2 = (**(code **)(*plVar11 + 0x48))(plVar11);
      return iVar2;
    }
    uVar13 = 0;
    if ((int)uVar3 < 1) {
      uVar3 = 0;
    }
    uVar12 = 0;
    for (; uVar3 != uVar13; uVar13 = uVar13 + 1) {
      plVar6 = (long *)(**(code **)(*plVar11 + 0x160))(plVar11,message,field,uVar13);
      iVar2 = (**(code **)(*plVar6 + 0x48))(plVar6);
      uVar12 = uVar12 + iVar2;
    }
    break;
  case 0xb:
    if (*(int *)(field + 0x30) != 3) {
      pMVar10 = (MessageLite *)(**(code **)(*plVar11 + 0xb0))(plVar11,message,field,0);
      iVar2 = WireFormatLite::MessageSize(pMVar10);
      return iVar2;
    }
    uVar13 = 0;
    if ((int)uVar3 < 1) {
      uVar3 = 0;
    }
    uVar12 = 0;
    for (; uVar3 != uVar13; uVar13 = uVar13 + 1) {
      pMVar10 = (MessageLite *)(**(code **)(*plVar11 + 0x160))(plVar11,message,field,uVar13);
      iVar2 = WireFormatLite::MessageSize(pMVar10);
      uVar12 = uVar12 + iVar2;
    }
    break;
  case 0xd:
    if (*(int *)(field + 0x30) != 3) {
      uVar5 = (**(code **)(*plVar11 + 0x78))(plVar11,message,field);
      iVar2 = io::CodedOutputStream::VarintSize32(uVar5);
      return iVar2;
    }
    uVar13 = 0;
    if ((int)uVar3 < 1) {
      uVar3 = 0;
    }
    uVar12 = 0;
    for (; uVar3 != uVar13; uVar13 = uVar13 + 1) {
      uVar5 = (**(code **)(*plVar11 + 0x128))(plVar11,message,field,uVar13);
      iVar2 = io::CodedOutputStream::VarintSize32(uVar5);
      uVar12 = uVar12 + iVar2;
    }
    break;
  case 0xe:
    if (*(int *)(field + 0x30) != 3) {
      lVar8 = (**(code **)(*plVar11 + 0xa8))(plVar11,message,field);
      iVar4 = *(int32 *)(lVar8 + 0x10);
      goto LAB_001ca996;
    }
    uVar13 = 0;
    if ((int)uVar3 < 1) {
      uVar3 = 0;
    }
    uVar12 = 0;
    for (; uVar3 != uVar13; uVar13 = uVar13 + 1) {
      lVar8 = (**(code **)(*plVar11 + 0x158))(plVar11,message,field,uVar13);
      iVar2 = io::CodedOutputStream::VarintSize32SignExtended(*(int32 *)(lVar8 + 0x10));
      uVar12 = uVar12 + iVar2;
    }
    break;
  case 0x11:
    if (*(int *)(field + 0x30) != 3) {
      iVar4 = (**(code **)(*plVar11 + 0x68))(plVar11,message,field);
      iVar2 = WireFormatLite::SInt32Size(iVar4);
      return iVar2;
    }
    uVar13 = 0;
    if ((int)uVar3 < 1) {
      uVar3 = 0;
    }
    uVar12 = 0;
    for (; uVar3 != uVar13; uVar13 = uVar13 + 1) {
      iVar4 = (**(code **)(*plVar11 + 0x118))(plVar11,message,field,uVar13);
      iVar2 = WireFormatLite::SInt32Size(iVar4);
      uVar12 = uVar12 + iVar2;
    }
    break;
  case 0x12:
    if (*(int *)(field + 0x30) != 3) {
      iVar9 = (**(code **)(*plVar11 + 0x70))(plVar11,message,field);
      iVar2 = WireFormatLite::SInt64Size(iVar9);
      return iVar2;
    }
    uVar13 = 0;
    if ((int)uVar3 < 1) {
      uVar3 = 0;
    }
    uVar12 = 0;
    for (; uVar3 != uVar13; uVar13 = uVar13 + 1) {
      iVar9 = (**(code **)(*plVar11 + 0x120))(plVar11,message,field,uVar13);
      iVar2 = WireFormatLite::SInt64Size(iVar9);
      uVar12 = uVar12 + iVar2;
    }
    break;
  default:
    uVar12 = 0;
  }
  return uVar12;
}

Assistant:

int WireFormat::FieldDataOnlyByteSize(
    const FieldDescriptor* field,
    const Message& message) {
  const Reflection* message_reflection = message.GetReflection();

  int count = 0;
  if (field->is_repeated()) {
    count = message_reflection->FieldSize(message, field);
  } else if (message_reflection->HasField(message, field)) {
    count = 1;
  }

  int data_size = 0;
  switch (field->type()) {
#define HANDLE_TYPE(TYPE, TYPE_METHOD, CPPTYPE_METHOD)                     \
    case FieldDescriptor::TYPE_##TYPE:                                     \
      if (field->is_repeated()) {                                          \
        for (int j = 0; j < count; j++) {                                  \
          data_size += WireFormatLite::TYPE_METHOD##Size(                  \
            message_reflection->GetRepeated##CPPTYPE_METHOD(               \
              message, field, j));                                         \
        }                                                                  \
      } else {                                                             \
        data_size += WireFormatLite::TYPE_METHOD##Size(                    \
          message_reflection->Get##CPPTYPE_METHOD(message, field));        \
      }                                                                    \
      break;

#define HANDLE_FIXED_TYPE(TYPE, TYPE_METHOD)                               \
    case FieldDescriptor::TYPE_##TYPE:                                     \
      data_size += count * WireFormatLite::k##TYPE_METHOD##Size;           \
      break;

    HANDLE_TYPE( INT32,  Int32,  Int32)
    HANDLE_TYPE( INT64,  Int64,  Int64)
    HANDLE_TYPE(SINT32, SInt32,  Int32)
    HANDLE_TYPE(SINT64, SInt64,  Int64)
    HANDLE_TYPE(UINT32, UInt32, UInt32)
    HANDLE_TYPE(UINT64, UInt64, UInt64)

    HANDLE_FIXED_TYPE( FIXED32,  Fixed32)
    HANDLE_FIXED_TYPE( FIXED64,  Fixed64)
    HANDLE_FIXED_TYPE(SFIXED32, SFixed32)
    HANDLE_FIXED_TYPE(SFIXED64, SFixed64)

    HANDLE_FIXED_TYPE(FLOAT , Float )
    HANDLE_FIXED_TYPE(DOUBLE, Double)

    HANDLE_FIXED_TYPE(BOOL, Bool)

    HANDLE_TYPE(GROUP  , Group  , Message)
    HANDLE_TYPE(MESSAGE, Message, Message)
#undef HANDLE_TYPE
#undef HANDLE_FIXED_TYPE

    case FieldDescriptor::TYPE_ENUM: {
      if (field->is_repeated()) {
        for (int j = 0; j < count; j++) {
          data_size += WireFormatLite::EnumSize(
            message_reflection->GetRepeatedEnum(message, field, j)->number());
        }
      } else {
        data_size += WireFormatLite::EnumSize(
          message_reflection->GetEnum(message, field)->number());
      }
      break;
    }

    // Handle strings separately so that we can get string references
    // instead of copying.
    case FieldDescriptor::TYPE_STRING:
    case FieldDescriptor::TYPE_BYTES: {
      for (int j = 0; j < count; j++) {
        string scratch;
        const string& value = field->is_repeated() ?
          message_reflection->GetRepeatedStringReference(
            message, field, j, &scratch) :
          message_reflection->GetStringReference(message, field, &scratch);
        data_size += WireFormatLite::StringSize(value);
      }
      break;
    }
  }
  return data_size;
}